

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plan.cpp
# Opt level: O3

void __thiscall imrt::Plan::Plan(Plan *this,EvaluationFunction *ev)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_Plan = (_func_int **)&PTR__Plan_0013b9f8;
  p_Var1 = &(this->angle2station)._M_t._M_impl.super__Rb_tree_header;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->angle2station)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
  _M_node.super__List_node_base._M_prev = (_List_node_base *)&this->stations;
  (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
  _M_node.super__List_node_base._M_next = (_List_node_base *)&this->stations;
  (this->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>._M_impl.
  _M_node._M_size = 0;
  this->last_changed = (Station *)0x0;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_prev = (_List_node_base *)&this->last_diff;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  .super__List_node_base._M_next = (_List_node_base *)&this->last_diff;
  (this->last_diff).
  super__List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>._M_impl._M_node
  ._M_size = 0;
  this->ev = ev;
  (this->w).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->w).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->w).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->Zmin).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Zmin).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Zmin).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->Zmax).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->Zmax).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->Zmax).super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  return;
}

Assistant:

Plan::Plan(EvaluationFunction &ev, vector<double> w, vector<double> Zmin, vector<double> Zmax): ev(ev), w(w), Zmin(Zmin), Zmax(Zmax) {
    last_changed=NULL;
  }